

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O3

ssize_t jaegertracing::net::http::Request::read(int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_0000003c;
  string response;
  istringstream responseStream;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  SocketReader::read_abi_cxx11_((int)(string *)local_1b0,__buf,__nbytes);
  std::__cxx11::istringstream::istringstream(local_190,(string *)local_1b0,_S_in);
  parse((Request *)CONCAT44(in_register_0000003c,__fd),(istream *)local_190);
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  return (ssize_t)(Request *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

Request Request::read(Socket & socket)
{
  std::string response = SocketReader::read(socket);
  std::istringstream responseStream(response);
  return Request::parse(responseStream);
}